

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetCompilePDBDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  pointer pcVar1;
  CompileInfo *pCVar2;
  
  pCVar2 = GetCompileInfo(this,config);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pCVar2 == (CompileInfo *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pcVar1 = (pCVar2->CompilePdbDir)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (pCVar2->CompilePdbDir)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmGeneratorTarget::GetCompilePDBDirectory(const std::string& config) const
{
  if(CompileInfo const* info = this->GetCompileInfo(config))
    {
    return info->CompilePdbDir;
    }
  return "";
}